

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O0

int fe_process_frames_int16
              (fe_t *fe,int16 **inout_spch,size_t *inout_nsamps,mfcc_t **buf_cep,
              int32 *inout_nframes)

{
  int iVar1;
  int16 *__src;
  int iVar2;
  int offset;
  int16 *orig_spch;
  int local_48;
  int orig_n_overflow;
  int n_overflow;
  int i;
  int outidx;
  int32 frame_count;
  int32 *inout_nframes_local;
  mfcc_t **buf_cep_local;
  size_t *inout_nsamps_local;
  int16 **inout_spch_local;
  fe_t *fe_local;
  
  if (buf_cep == (mfcc_t **)0x0) {
    if (*inout_nsamps + (long)fe->num_overflow_samps < (ulong)(long)fe->frame_size) {
      *inout_nframes = 0;
    }
    else {
      *inout_nframes =
           (int)(((*inout_nsamps + (long)fe->num_overflow_samps) - (long)fe->frame_size) /
                (ulong)(long)fe->frame_shift) + 1;
    }
    fe_local._4_4_ = *inout_nframes;
  }
  else if (*inout_nsamps + (long)fe->num_overflow_samps < (ulong)(long)fe->frame_size) {
    if (*inout_nsamps != 0) {
      memcpy(fe->overflow_samps + fe->num_overflow_samps,*inout_spch,*inout_nsamps << 1);
      fe->num_overflow_samps = fe->num_overflow_samps + (int)*inout_nsamps;
      *inout_spch = *inout_spch + *inout_nsamps;
      *inout_nsamps = 0;
    }
    *inout_nframes = 0;
    fe_local._4_4_ = 0;
  }
  else if (*inout_nframes < 1) {
    *inout_nframes = 0;
    fe_local._4_4_ = 0;
  }
  else {
    __src = *inout_spch;
    iVar1 = fe->num_overflow_samps;
    i = (int)(((*inout_nsamps + (long)fe->num_overflow_samps) - (long)fe->frame_size) /
             (ulong)(long)fe->frame_shift) + 1;
    if (*inout_nframes < i) {
      i = *inout_nframes;
    }
    if (fe->num_overflow_samps == 0) {
      fe_read_frame_int16(fe,*inout_spch,(int)fe->frame_size);
      if (i < 1) {
        __assert_fail("outidx < frame_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                      ,0x1ab,
                      "int fe_process_frames_int16(fe_t *, const int16 **, size_t *, mfcc_t **, int32 *)"
                     );
      }
      fe_write_frame(fe,*buf_cep);
      *inout_spch = *inout_spch + (int)fe->frame_size;
      *inout_nsamps = *inout_nsamps - (long)fe->frame_size;
    }
    else {
      iVar2 = (int)fe->frame_size - fe->num_overflow_samps;
      memcpy(fe->overflow_samps + fe->num_overflow_samps,*inout_spch,(long)iVar2 << 1);
      fe_read_frame_int16(fe,fe->overflow_samps,(int)fe->frame_size);
      if (i < 1) {
        __assert_fail("outidx < frame_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                      ,0x1a1,
                      "int fe_process_frames_int16(fe_t *, const int16 **, size_t *, mfcc_t **, int32 *)"
                     );
      }
      fe_write_frame(fe,*buf_cep);
      *inout_spch = *inout_spch + iVar2;
      *inout_nsamps = *inout_nsamps - (long)iVar2;
      fe->num_overflow_samps = fe->num_overflow_samps - (int)fe->frame_shift;
    }
    n_overflow = 1;
    for (orig_n_overflow = 1; orig_n_overflow < i; orig_n_overflow = orig_n_overflow + 1) {
      if (*inout_nsamps < (ulong)(long)fe->frame_shift) {
        __assert_fail("*inout_nsamps >= (size_t)fe->frame_shift",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                      ,0x1b5,
                      "int fe_process_frames_int16(fe_t *, const int16 **, size_t *, mfcc_t **, int32 *)"
                     );
      }
      fe_shift_frame_int16(fe,*inout_spch,(int)fe->frame_shift);
      if (i <= n_overflow) {
        __assert_fail("outidx < frame_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                      ,0x1b8,
                      "int fe_process_frames_int16(fe_t *, const int16 **, size_t *, mfcc_t **, int32 *)"
                     );
      }
      fe_write_frame(fe,buf_cep[n_overflow]);
      n_overflow = n_overflow + 1;
      *inout_spch = *inout_spch + (int)fe->frame_shift;
      *inout_nsamps = *inout_nsamps - (long)fe->frame_shift;
      if (0 < fe->num_overflow_samps) {
        fe->num_overflow_samps = fe->num_overflow_samps - (int)fe->frame_shift;
      }
    }
    if (fe->num_overflow_samps < 1) {
      local_48 = (int)*inout_nsamps;
      if (fe->frame_shift < local_48) {
        local_48 = (int)fe->frame_shift;
      }
      fe->num_overflow_samps = (int)fe->frame_size - (int)fe->frame_shift;
      if ((long)*inout_spch - (long)__src >> 1 < (long)fe->num_overflow_samps) {
        fe->num_overflow_samps = (int)((long)*inout_spch - (long)__src >> 1);
      }
      fe->num_overflow_samps = local_48 + fe->num_overflow_samps;
      if (0 < fe->num_overflow_samps) {
        memcpy(fe->overflow_samps,*inout_spch + -(long)((int)fe->frame_size - (int)fe->frame_shift),
               (long)fe->num_overflow_samps << 1);
        *inout_spch = *inout_spch + local_48;
        *inout_nsamps = *inout_nsamps - (long)local_48;
      }
    }
    else {
      memmove(fe->overflow_samps,fe->overflow_samps + ((long)iVar1 - (long)fe->num_overflow_samps),
              (long)fe->num_overflow_samps << 1);
      local_48 = (int)((long)*inout_spch - (long)__src >> 1) + (int)*inout_nsamps;
      if ((int)fe->frame_size - fe->num_overflow_samps < local_48) {
        local_48 = (int)fe->frame_size - fe->num_overflow_samps;
      }
      memcpy(fe->overflow_samps + fe->num_overflow_samps,__src,(long)local_48 << 1);
      fe->num_overflow_samps = local_48 + fe->num_overflow_samps;
      if ((long)*inout_spch - (long)__src >> 1 < (long)local_48) {
        local_48 = local_48 - (int)((long)*inout_spch - (long)__src >> 1);
        *inout_spch = *inout_spch + local_48;
        *inout_nsamps = *inout_nsamps - (long)local_48;
      }
    }
    *inout_nframes = n_overflow;
    fe_local._4_4_ = 0;
  }
  return fe_local._4_4_;
}

Assistant:

int
fe_process_frames_int16(fe_t *fe,
                  int16 const **inout_spch,
                  size_t *inout_nsamps,
                  mfcc_t **buf_cep,
                  int32 *inout_nframes)
{
    int32 frame_count;
    int outidx, i, n_overflow, orig_n_overflow;
    int16 const *orig_spch;

    /* In the special case where there is no output buffer, return the
     * maximum number of frames which would be generated. */
    if (buf_cep == NULL) {
        if (*inout_nsamps + fe->num_overflow_samps < (size_t)fe->frame_size)
            *inout_nframes = 0;
        else
            *inout_nframes = 1
                + ((*inout_nsamps + fe->num_overflow_samps - fe->frame_size)
                   / fe->frame_shift);
        return *inout_nframes;
    }

    /* Are there not enough samples to make at least 1 frame? */
    if (*inout_nsamps + fe->num_overflow_samps < (size_t)fe->frame_size) {
        if (*inout_nsamps > 0) {
            /* Append them to the overflow buffer. */
            memcpy(fe->overflow_samps + fe->num_overflow_samps,
                   *inout_spch, *inout_nsamps * (sizeof(**inout_spch)));
            fe->num_overflow_samps += *inout_nsamps;
            /* Update input-output pointers and counters. */
            *inout_spch += *inout_nsamps;
            *inout_nsamps = 0;
        }
        /* We produced no frames of output, sorry! */
        *inout_nframes = 0;
        return 0;
    }

    /* Can't write a frame?  Then do nothing! */
    if (*inout_nframes < 1) {
        *inout_nframes = 0;
        return 0;
    }

    /* Keep track of the original start of the buffer. */
    orig_spch = *inout_spch;
    orig_n_overflow = fe->num_overflow_samps;
    /* How many frames will we be able to get? */
    frame_count = 1
        + ((*inout_nsamps + fe->num_overflow_samps - fe->frame_size)
           / fe->frame_shift);
    /* Limit it to the number of output frames available. */
    if (frame_count > *inout_nframes)
        frame_count = *inout_nframes;
    /* Index of output frame. */
    outidx = 0;

    /* Start processing, taking care of any incoming overflow. */
    if (fe->num_overflow_samps) {
        int offset = fe->frame_size - fe->num_overflow_samps;

        /* Append start of spch to overflow samples to make a full frame. */
        memcpy(fe->overflow_samps + fe->num_overflow_samps,
               *inout_spch, offset * sizeof(**inout_spch));
        fe_read_frame_int16(fe, fe->overflow_samps, fe->frame_size);
        assert(outidx < frame_count);
        fe_write_frame(fe, buf_cep[outidx]);
        outidx++;
        /* Update input-output pointers and counters. */
        *inout_spch += offset;
        *inout_nsamps -= offset;
        fe->num_overflow_samps -= fe->frame_shift;
    }
    else {
        fe_read_frame_int16(fe, *inout_spch, fe->frame_size);
        assert(outidx < frame_count);
        fe_write_frame(fe, buf_cep[outidx]);
        outidx++;
        /* Update input-output pointers and counters. */
        *inout_spch += fe->frame_size;
        *inout_nsamps -= fe->frame_size;
    }

    /* Process all remaining frames. */
    for (i = 1; i < frame_count; ++i) {
        assert(*inout_nsamps >= (size_t)fe->frame_shift);

        fe_shift_frame_int16(fe, *inout_spch, fe->frame_shift);
        assert(outidx < frame_count);
        fe_write_frame(fe, buf_cep[outidx]);
        outidx++;
        /* Update input-output pointers and counters. */
        *inout_spch += fe->frame_shift;
        *inout_nsamps -= fe->frame_shift;
        /* Amount of data behind the original input which is still needed. */
        if (fe->num_overflow_samps > 0)
            fe->num_overflow_samps -= fe->frame_shift;
    }

    /* How many relevant overflow samples are there left? */
    if (fe->num_overflow_samps <= 0) {
        /* Maximum number of overflow samples past *inout_spch to save. */
        n_overflow = *inout_nsamps;
        if (n_overflow > fe->frame_shift)
            n_overflow = fe->frame_shift;
        fe->num_overflow_samps = fe->frame_size - fe->frame_shift;
        /* Make sure this isn't an illegal read! */
        if (fe->num_overflow_samps > *inout_spch - orig_spch)
            fe->num_overflow_samps = *inout_spch - orig_spch;
        fe->num_overflow_samps += n_overflow;
        if (fe->num_overflow_samps > 0) {
            memcpy(fe->overflow_samps,
                   *inout_spch - (fe->frame_size - fe->frame_shift),
                   fe->num_overflow_samps * sizeof(**inout_spch));
            /* Update the input pointer to cover this stuff. */
            *inout_spch += n_overflow;
            *inout_nsamps -= n_overflow;
        }
    }
    else {
        /* There is still some relevant data left in the overflow buffer. */
        /* Shift existing data to the beginning. */
        memmove(fe->overflow_samps,
                fe->overflow_samps + orig_n_overflow - fe->num_overflow_samps,
                fe->num_overflow_samps * sizeof(*fe->overflow_samps));
        /* Copy in whatever we had in the original speech buffer. */
        n_overflow = *inout_spch - orig_spch + *inout_nsamps;
        if (n_overflow > fe->frame_size - fe->num_overflow_samps)
            n_overflow = fe->frame_size - fe->num_overflow_samps;
        memcpy(fe->overflow_samps + fe->num_overflow_samps,
               orig_spch, n_overflow * sizeof(*orig_spch));
        fe->num_overflow_samps += n_overflow;
        /* Advance the input pointers. */
        if (n_overflow > *inout_spch - orig_spch) {
            n_overflow -= (*inout_spch - orig_spch);
            *inout_spch += n_overflow;
            *inout_nsamps -= n_overflow;
        }
    }

    /* Finally update the frame counter with the number of frames we processed. */
    *inout_nframes = outidx; /* FIXME: Not sure why I wrote it this way... */
    return 0;
}